

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O2

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t (*pauVar5) [2048];
  long lVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  long lVar9;
  ulong uVar10;
  uint32_t sum [3];
  uint32_t hist [3] [2048];
  
  uVar4 = (ulong)size;
  memset(hist,0,0x6000);
  for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
    uVar1 = keys_in[uVar10];
    pauVar5 = hist;
    for (lVar6 = 0; lVar6 != 0x21; lVar6 = lVar6 + 0xb) {
      (*pauVar5)[uVar1 >> ((byte)lVar6 & 0x1f) & 0x7ff] =
           (*pauVar5)[uVar1 >> ((byte)lVar6 & 0x1f) & 0x7ff] + 1;
      pauVar5 = pauVar5 + 1;
    }
  }
  pauVar5 = hist;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    uVar2 = (*pauVar5)[0];
    (*pauVar5)[0] = 0;
    sum[lVar6] = uVar2;
    pauVar5 = pauVar5 + 1;
  }
  puVar7 = hist[0];
  for (lVar6 = 1; puVar7 = puVar7 + 1, lVar6 != 0x800; lVar6 = lVar6 + 1) {
    puVar8 = puVar7;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      uVar2 = sum[lVar9];
      uVar3 = *puVar8;
      *puVar8 = uVar2;
      sum[lVar9] = uVar3 + uVar2;
      puVar8 = puVar8 + 0x800;
    }
  }
  RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (keys_in,keys_temp,values_in,values_temp,uVar4,hist,0);
  RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (keys_temp,keys_in,values_temp,values_in,uVar4,hist + 1,0xb);
  RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (keys_in,keys_temp,values_in,values_temp,uVar4,hist + 2,0x16);
  return 1;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }